

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::testSetSampleCounts(Box2i *dataWindow)

{
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  TypedDeepImageChannel<float> *pTVar4;
  size_t sVar5;
  long lVar6;
  uint *puVar7;
  int *in_RDI;
  float fVar8;
  int j_3;
  int j_2;
  int j_1;
  int j;
  float oldSamples [20];
  int newN;
  int oldN;
  int y;
  int x;
  size_t i;
  int MAX_SAMPLES;
  SampleCountChannel *sampleCounts;
  DeepFloatChannel *channel;
  DeepImageLevel *level;
  Rand48 random;
  DeepImage img;
  unsigned_long in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  string *in_stack_fffffffffffffdf8;
  DeepImageLevel *in_stack_fffffffffffffe00;
  allocator<char> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  int local_168;
  uint local_164;
  int local_160;
  int local_15c;
  float afStack_158 [20];
  int local_108;
  uint local_104;
  uint local_100;
  int local_fc;
  ulong local_f8;
  undefined4 local_ec;
  SampleCountChannel *local_e8;
  allocator<char> local_d9;
  string local_d8 [32];
  TypedDeepImageChannel<float> *local_b8;
  DeepImageLevel *local_b0;
  allocator<char> local_a1;
  string local_a0 [48];
  DeepImage local_70 [104];
  int *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"change sample counts, data window = (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*local_8);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_8[1]);
  poVar3 = std::operator<<(poVar3,") - (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_8[2]);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_8[3]);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imf_3_4::DeepImage::DeepImage(local_70);
  Imf_3_4::Image::resize((Box *)local_70,(LevelMode)local_8,ROUND_DOWN);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  Imf_3_4::Image::insertChannel((string *)local_70,(PixelType)local_a0,2,1,true);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffde8);
  local_b0 = (DeepImageLevel *)Imf_3_4::DeepImage::level((int)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  pTVar4 = Imf_3_4::DeepImageLevel::typedChannel<float>
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_b8 = pTVar4;
  local_e8 = Imf_3_4::DeepImageLevel::sampleCounts(local_b0);
  local_ec = 0x14;
  local_f8 = 0;
  do {
    uVar1 = local_f8;
    sVar5 = Imf_3_4::ImageChannel::numPixels((ImageChannel *)local_b8);
    if (sVar5 <= uVar1) {
      Imf_3_4::DeepImage::~DeepImage(local_70);
      return;
    }
    iVar9 = *local_8;
    lVar6 = Imath_3_2::Rand48::nexti((Rand48 *)0x116d25);
    iVar2 = Imf_3_4::ImageChannel::pixelsPerRow((ImageChannel *)local_b8);
    local_fc = iVar9 + (int)(lVar6 % (long)iVar2);
    iVar9 = local_8[1];
    lVar6 = Imath_3_2::Rand48::nexti((Rand48 *)0x116d76);
    iVar2 = Imf_3_4::ImageChannel::pixelsPerColumn((ImageChannel *)local_b8);
    local_100 = iVar9 + (int)(lVar6 % (long)iVar2);
    puVar7 = Imf_3_4::SampleCountChannel::at
                       ((SampleCountChannel *)in_stack_fffffffffffffe00,
                        (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                        (int)in_stack_fffffffffffffdf8);
    local_104 = *puVar7;
    lVar6 = Imath_3_2::Rand48::nexti((Rand48 *)0x116de6);
    local_108 = (int)(lVar6 % 0x15);
    for (local_15c = 0; local_15c < (int)local_104; local_15c = local_15c + 1) {
      lVar6 = Imf_3_4::TypedDeepImageChannel<float>::operator()((int)local_b8,local_fc);
      afStack_158[local_15c] = *(float *)(lVar6 + (long)local_15c * 4);
    }
    Imf_3_4::SampleCountChannel::set((int)local_e8,local_fc,local_100);
    if ((int)local_104 < local_108) {
      for (local_160 = 0; local_160 < (int)local_104; local_160 = local_160 + 1) {
        lVar6 = Imf_3_4::TypedDeepImageChannel<float>::operator()((int)local_b8,local_fc);
        fVar8 = *(float *)(lVar6 + (long)local_160 * 4);
        if ((fVar8 != afStack_158[local_160]) || (NAN(fVar8) || NAN(afStack_158[local_160]))) {
          __assert_fail("channel (x, y)[j] == oldSamples[j]",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                        ,0x1ad,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
      }
      for (local_164 = local_104; (int)local_164 < local_108; local_164 = local_164 + 1) {
        lVar6 = Imf_3_4::TypedDeepImageChannel<float>::operator()((int)local_b8,local_fc);
        fVar8 = *(float *)(lVar6 + (long)(int)local_164 * 4);
        if ((fVar8 != 0.0) || (NAN(fVar8))) {
          __assert_fail("channel (x, y)[j] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                        ,0x1b1,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
        in_stack_fffffffffffffe00 = (DeepImageLevel *)Imath_3_2::Rand48::nextf((Rand48 *)0x11708d);
        fVar8 = (float)(double)in_stack_fffffffffffffe00;
        in_stack_fffffffffffffdf8 =
             (string *)Imf_3_4::TypedDeepImageChannel<float>::operator()((int)local_b8,local_fc);
        *(float *)(&in_stack_fffffffffffffdf8->_M_dataplus + (long)(int)local_164 * 4) = fVar8;
      }
    }
    else {
      for (local_168 = 0; local_168 < local_108; local_168 = local_168 + 1) {
        lVar6 = Imf_3_4::TypedDeepImageChannel<float>::operator()((int)local_b8,local_fc);
        fVar8 = *(float *)(lVar6 + (long)local_168 * 4);
        if ((fVar8 != afStack_158[local_168]) || (NAN(fVar8) || NAN(afStack_158[local_168]))) {
          __assert_fail("channel (x, y)[j] == oldSamples[j]",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                        ,0x1b8,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
      }
    }
    local_f8 = local_f8 + 1;
  } while( true );
}

Assistant:

void
testSetSampleCounts (const Box2i& dataWindow)
{
    cout << "change sample counts, data window = "
            "("
         << dataWindow.min.x << ", " << dataWindow.min.y
         << ") - "
            "("
         << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    DeepImage img;
    img.resize (dataWindow, ONE_LEVEL, ROUND_DOWN);
    img.insertChannel ("F", FLOAT, 1, 1, false);

    Rand48 random (0);

    DeepImageLevel&     level        = img.level ();
    DeepFloatChannel&   channel      = level.typedChannel<float> ("F");
    SampleCountChannel& sampleCounts = level.sampleCounts ();

    const int MAX_SAMPLES = 20;

    for (size_t i = 0; i < channel.numPixels (); ++i)
    {
        int x = dataWindow.min.x + random.nexti () % channel.pixelsPerRow ();
        int y = dataWindow.min.y + random.nexti () % channel.pixelsPerColumn ();

        int oldN = sampleCounts.at (x, y);
        int newN = random.nexti () % (MAX_SAMPLES + 1);

        float oldSamples[MAX_SAMPLES];

        for (int j = 0; j < oldN; ++j)
            oldSamples[j] = channel (x, y)[j];

        sampleCounts.set (x, y, newN);

        if (newN > oldN)
        {
            for (int j = 0; j < oldN; ++j)
                assert (channel (x, y)[j] == oldSamples[j]);

            for (int j = oldN; j < newN; ++j)
            {
                assert (channel (x, y)[j] == 0);
                channel (x, y)[j] = random.nextf ();
            }
        }
        else
        {
            for (int j = 0; j < newN; ++j)
                assert (channel (x, y)[j] == oldSamples[j]);
        }
    }
}